

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O3

uint __thiscall
ON_SubDQuadNeighborhood::SetLimitSubSurfaceExactCVs
          (ON_SubDQuadNeighborhood *this,bool bEnableApproximatePatch,uint quadrant_index)

{
  ON_SubDFace *pOVar1;
  double (*padVar2) [3];
  ON_SubDVertex *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double (*paadVar8) [5] [3];
  double (*paadVar9) [5] [3];
  bool bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  int iVar17;
  double *pdVar18;
  long lVar19;
  double (*padVar20) [3];
  int iVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  undefined7 in_register_00000031;
  long lVar25;
  double *pdVar26;
  double *pdVar27;
  ulong uVar28;
  int iVar29;
  undefined4 uVar30;
  undefined4 uVar31;
  ON_2dex srf_cv_dex [8];
  ulong local_238;
  undefined4 local_22c;
  double local_228 [5];
  double local_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  double (*local_1e0) [5] [3];
  uint local_1d8;
  uint local_1d4;
  ON_SubDQuadNeighborhood *local_1d0;
  ulong local_1c8;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  double *local_1a8;
  double *local_1a0;
  double (*local_198) [3];
  double *local_190;
  double *local_188;
  double (*local_180) [3];
  double *local_178;
  double *local_170;
  double (*local_168) [3];
  double *local_160;
  double *local_158;
  double (*local_150) [3];
  ON_SubDEdge *(*local_148) [2];
  ON_SubDFace *(*local_140) [3];
  double (*local_138 [3]) [3];
  double *local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  double *local_100;
  double *local_f8;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  double *local_a8;
  double *local_a0;
  ON_2dex local_98;
  ON_2dex local_90;
  ON_2dex local_88;
  ON_2dex local_80;
  ON_2dex local_78;
  ON_2dex local_70;
  ON_2dex local_68;
  ON_2dex local_60;
  ON_SubDVertex *local_58 [5];
  
  uVar23 = (uint)this->m_current_subdivision_level;
  local_22c = 0;
  if (this->m_current_subdivision_level <= this->m_initial_subdivision_level) {
    uVar23 = 0;
  }
  if (((int)CONCAT71(in_register_00000031,bEnableApproximatePatch) != 0) &&
     (((byte)uVar23 < 2 || (local_22c = 1, 1 < this->m_extraordinary_corner_vertex_count)))) {
    ON_SubDIncrementErrorCount();
    local_22c = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_limit.cpp"
               ,0x543,"","bEnableApproximatePatch should be false at this stage.");
  }
  pOVar1 = this->m_face_grid[1][1];
  if (((pOVar1 == (ON_SubDFace *)0x0) || (4 < quadrant_index)) || (pOVar1->m_edge_count != 4)) {
LAB_0061a5c8:
    ON_SubDIncrementErrorCount();
    uVar22 = 0;
  }
  else {
    local_140 = this->m_face_grid;
    local_58[0] = this->m_vertex_grid[1][1];
    local_58[1] = this->m_vertex_grid[2][1];
    local_58[2] = this->m_vertex_grid[2][2];
    local_58[3] = this->m_vertex_grid[1][2];
    lVar13 = 0;
    do {
      if ((local_58[lVar13] == (ON_SubDVertex *)0x0) ||
         (this->m_center_edges[lVar13] == (ON_SubDEdge *)0x0)) goto LAB_0061a5c8;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 4);
    local_1e0 = this->m_srf_cv1;
    bVar10 = ON_IsValid(this->m_srf_cv1[2][2][0]);
    if (!bVar10) {
      bVar10 = ON_SubDFace::GetSubdivisionPoint(this->m_face_grid[1][1],&local_1f8);
      if (!bVar10) goto LAB_0061a5c8;
      ON_2dex::ON_2dex(&local_98,1,1);
      ON_2dex::ON_2dex(&local_90,2,1);
      ON_2dex::ON_2dex(&local_88,3,1);
      ON_2dex::ON_2dex(&local_80,3,2);
      ON_2dex::ON_2dex(&local_78,3,3);
      ON_2dex::ON_2dex(&local_70,2,3);
      ON_2dex::ON_2dex(&local_68,1,3);
      ON_2dex::ON_2dex(&local_60,1,2);
      lVar13 = 0;
      do {
        bVar10 = ON_SubDVertex::GetSubdivisionPoint
                           (*(ON_SubDVertex **)((long)local_58 + lVar13),local_228);
        if ((!bVar10) ||
           (bVar10 = ON_SubDEdge::GetSubdivisionPoint
                               (*(ON_SubDEdge **)((long)this->m_center_edges + lVar13),local_228 + 3
                               ), !bVar10)) goto LAB_0061a5c8;
        iVar29 = *(int *)((long)&local_98.i + lVar13 * 2);
        iVar17 = *(int *)((long)&local_98.j + lVar13 * 2);
        local_1e0[iVar29][iVar17][0] = local_228[0];
        local_1e0[iVar29][iVar17][1] = local_228[1];
        local_1e0[iVar29][iVar17][2] = local_228[2];
        iVar12 = *(int *)((long)&local_90.i + lVar13 * 2);
        iVar24 = *(int *)((long)&local_90.j + lVar13 * 2);
        local_1e0[iVar12][iVar24][0] = local_228[3];
        local_1e0[iVar12][iVar24][1] = local_228[4];
        local_1e0[iVar12][iVar24][2] = local_200;
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0x20);
      local_138[0] = local_1e0[iVar29] + iVar17;
      local_138[1] = local_1e0[iVar12] + iVar24;
      this->m_srf_cv1[2][2][0] = local_1f8;
      this->m_srf_cv1[2][2][1] = dStack_1f0;
      this->m_srf_cv1[2][2][2] = local_1e8;
    }
    uVar22 = 0;
    uVar11 = quadrant_index;
    if (quadrant_index == 4) {
      uVar11 = 0;
    }
    local_1b8 = quadrant_index + 1;
    if (quadrant_index == 4) {
      local_1b8 = 4;
    }
    if (uVar11 < local_1b8) {
      local_148 = this->m_edge_grid;
      local_a8 = this->m_srf_cv1[0][3] + 1;
      local_b0 = this->m_srf_cv1[0][3] + 2;
      local_b8 = this->m_srf_cv1[3][4] + 1;
      local_c0 = this->m_srf_cv1[3][4] + 2;
      local_c8 = this->m_srf_cv1[4][1] + 1;
      local_d0 = this->m_srf_cv1[4][1] + 2;
      local_d8 = this->m_srf_cv1[1][0] + 1;
      local_e0 = this->m_srf_cv1[1][0] + 2;
      local_e8 = this->m_srf_cv1[1][4] + 1;
      local_f0 = this->m_srf_cv1[1][4] + 2;
      local_f8 = this->m_srf_cv1[4][3] + 1;
      uVar15 = (ulong)uVar11;
      local_100 = this->m_srf_cv1[4][3] + 2;
      local_108 = this->m_srf_cv1[3][0] + 1;
      local_110 = this->m_srf_cv1[3][0] + 2;
      local_118 = this->m_srf_cv1[0][1] + 1;
      local_120 = this->m_srf_cv1[0][1] + 2;
      local_150 = this->m_srf_cv1[1] + 2;
      local_158 = this->m_srf_cv1[1][2] + 1;
      local_160 = this->m_srf_cv1[1][2] + 2;
      local_168 = this->m_srf_cv1[2] + 3;
      local_170 = this->m_srf_cv1[2][3] + 1;
      local_178 = this->m_srf_cv1[2][3] + 2;
      local_180 = this->m_srf_cv1[3] + 2;
      local_188 = this->m_srf_cv1[3][2] + 1;
      local_190 = this->m_srf_cv1[3][2] + 2;
      local_198 = this->m_srf_cv1[2] + 1;
      local_1a0 = this->m_srf_cv1[2][1] + 1;
      local_1a8 = this->m_srf_cv1[2][1] + 2;
      local_a0 = this->m_srf_cv1[0][0] + 2;
      uVar22 = 0;
      local_1d8 = 0;
      local_1d0 = this;
      local_1b0 = uVar23;
      do {
        local_238 = uVar15;
        if (this->m_bExactQuadrantPatch[uVar15] == true) {
          local_1d8 = local_1d8 + 1;
LAB_00619a36:
          local_1bc = (int)uVar15 - 1;
          local_1c8 = (ulong)(local_1bc & 3);
          uVar23 = 1;
          iVar29 = 9;
          local_1b4 = uVar22;
          do {
            uVar11 = (uint)local_1c8;
            if ((char)uVar23 != '\0') {
              uVar11 = (uint)uVar15;
            }
            local_1d4 = uVar11 - 1;
            if (local_1d4 < 3) {
              uVar28 = (ulong)local_1d4;
              iVar17 = *(int *)(&DAT_006d3b08 + uVar28 * 4);
              uVar15 = *(ulong *)(&DAT_006d38e0 + uVar28 * 8);
              iVar12 = *(int *)(&DAT_006d38f8 + uVar28 * 4);
              iVar24 = *(int *)(&DAT_006d3904 + uVar28 * 4);
              iVar21 = 2 - uVar11;
            }
            else {
              iVar12 = 0;
              uVar15 = 1;
              iVar17 = 1;
              iVar24 = 1;
              iVar21 = 0;
            }
            local_138[0] = local_1e0[(uint)uVar15 & 7] + (uVar15 >> 0x20);
            paadVar8 = local_1e0 + (iVar17 + iVar24);
            paadVar9 = local_1e0 + (iVar17 + iVar24 + iVar24);
            local_1ac = uVar23;
            local_138[1] = *paadVar8 + (iVar12 + iVar21);
            local_138[2] = *paadVar9 + (iVar12 + iVar21 + iVar21);
            bVar10 = ON_IsValid((*local_138[0])[0]);
            if (((bVar10) && (bVar10 = ON_IsValid((*paadVar8)[iVar12 + iVar21][0]), bVar10)) &&
               (bVar10 = ON_IsValid((*paadVar9)[iVar12 + iVar21 + iVar21][0]), bVar10)) {
              iVar29 = iVar29 + 3;
              uVar15 = local_238;
              this = local_1d0;
            }
            else {
              this = local_1d0;
              uVar28 = (ulong)uVar11;
              if ((char)local_22c == '\0') {
                if (local_1d0->m_bBoundaryCrease[uVar28] != true) goto LAB_00619b85;
LAB_00619bf6:
                if (local_1d4 < 3) {
                  uVar15 = (ulong)local_1d4;
                  lVar13 = *(long *)(&DAT_006d39a0 + uVar15 * 8);
                  lVar19 = *(long *)(&DAT_006d39b8 + uVar15 * 8);
                  lVar14 = *(long *)(&DAT_006d3910 + uVar15 * 8);
                }
                else {
                  uVar28 = 2;
                  lVar13 = 1;
                  lVar19 = 1;
                  lVar14 = 1;
                }
                lVar25 = 0x10;
                pdVar16 = local_a0;
                do {
                  dVar7 = pdVar16[lVar19 * 3 + lVar13 * 0xf + -2];
                  dVar6 = (pdVar16 + lVar19 * 3 + lVar13 * 0xf + -2)[1];
                  dVar6 = (dVar6 + dVar6) - (pdVar16 + uVar28 * 3 + lVar14 * 0xf + -2)[1];
                  auVar5._8_4_ = SUB84(dVar6,0);
                  auVar5._0_8_ = (dVar7 + dVar7) - pdVar16[uVar28 * 3 + lVar14 * 0xf + -2];
                  auVar5._12_4_ = (int)((ulong)dVar6 >> 0x20);
                  *(undefined1 (*) [16])((long)&local_238 + lVar25) = auVar5;
                  *(double *)((long)local_228 + lVar25) =
                       (pdVar16[lVar19 * 3 + lVar13 * 0xf] + pdVar16[lVar19 * 3 + lVar13 * 0xf]) -
                       pdVar16[uVar28 * 3 + lVar14 * 0xf];
                  pdVar16 = pdVar16 + (long)iVar21 * 3 + (long)iVar24 * 0xf;
                  lVar25 = lVar25 + 0x18;
                  uVar15 = local_238;
                } while (lVar25 != 0x58);
              }
              else {
                bVar10 = ON_SubDEdge::IsCrease(local_1d0->m_center_edges[uVar28]);
                if (bVar10) goto LAB_00619bf6;
LAB_00619b85:
                uVar23 = local_1d4;
                uVar15 = local_238;
                if ((((byte)local_1b0 < 2) && (this->m_bExactQuadrantPatch[local_238] == false)) ||
                   (bVar10 = ON_SubDEdge::IsSmoothNotX(this->m_center_edges[uVar28]), !bVar10))
                goto LAB_00619d0f;
                if (local_148[uVar28][0] == (ON_SubDEdge *)0x0) {
                  if (this->m_bExactQuadrantPatch[uVar15] == true) goto LAB_0061a5c8;
                  local_228[0] = -1.23432101234321e+308;
                }
                else {
                  bVar10 = ON_SubDEdge::GetSubdivisionPoint(local_148[uVar28][0],local_228);
                  if (!bVar10) goto LAB_0061a5c8;
                }
                if (uVar23 < 3) {
                  lVar19 = 2 - (ulong)uVar23;
                  lVar13 = *(long *)(&DAT_006d3928 + (ulong)uVar23 * 8);
                }
                else {
                  lVar19 = 1;
                  lVar13 = 0;
                }
                if (local_140[lVar19][lVar13] == (ON_SubDFace *)0x0) {
                  if (this->m_bExactQuadrantPatch[uVar15] == true) goto LAB_0061a5c8;
                  local_228[3] = -1.23432101234321e+308;
                }
                else {
                  bVar10 = ON_SubDFace::GetSubdivisionPoint(local_140[lVar19][lVar13],local_228 + 3)
                  ;
                  if (!bVar10) goto LAB_0061a5c8;
                }
                if (local_148[uVar28][1] == (ON_SubDEdge *)0x0) {
                  if (this->m_bExactQuadrantPatch[uVar15] == true) goto LAB_0061a5c8;
                  local_1f8 = -1.23432101234321e+308;
                }
                else {
                  bVar10 = ON_SubDEdge::GetSubdivisionPoint(local_148[uVar28][1],&local_1f8);
                  if (!bVar10) goto LAB_0061a5c8;
                }
              }
              pdVar16 = local_228;
              lVar13 = 0;
              do {
                padVar2 = local_138[lVar13];
                bVar10 = ON_IsValid((*padVar2)[0]);
                if (bVar10) {
                  iVar29 = iVar29 + 1;
                }
                else {
                  bVar10 = ON_IsValid(*pdVar16);
                  if (bVar10) {
                    iVar29 = iVar29 + 1;
                    (*padVar2)[0] = *pdVar16;
                    (*padVar2)[1] = pdVar16[1];
                    (*padVar2)[2] = pdVar16[2];
                  }
                }
                lVar13 = lVar13 + 1;
                pdVar16 = pdVar16 + 3;
              } while (lVar13 != 3);
            }
LAB_00619d0f:
            uVar11 = local_1bc;
            uVar23 = 0;
          } while ((local_1ac & 1) != 0);
          if ((this->m_bExactQuadrantPatch[uVar15] != false) ||
             ((char)local_22c == '\x01' && this->m_bExtraordinaryCornerVertex[uVar15] == false)) {
            uVar15 = (ulong)local_1bc;
            if (local_1bc < 3) {
              lVar13 = *(long *)(&DAT_006d3940 + (ulong)local_1bc * 8);
              lVar19 = *(long *)(&DAT_006d3958 + (ulong)local_1bc * 8);
            }
            else {
              lVar13 = 0;
              lVar19 = 0;
            }
            padVar2 = local_1e0[lVar13] + lVar19;
            local_138[0] = padVar2;
            bVar10 = ON_IsValid((*padVar2)[0]);
            if (bVar10) {
              iVar29 = iVar29 + 1;
            }
            else {
              this_00 = local_58[local_238];
              bVar10 = ON_SubDVertex::IsSmooth(this_00);
              if (bVar10) {
                if ((this_00->m_edge_count == 4) && (this_00->m_face_count == 4)) {
                  if (uVar11 < 3) {
                    lVar13 = *(long *)(&DAT_006d3970 + uVar15 * 8);
                    lVar19 = *(long *)(&DAT_006d3988 + uVar15 * 8);
                  }
                  else {
                    lVar13 = 0;
                    lVar19 = 0;
                  }
                  if ((local_140[lVar13][lVar19] == (ON_SubDFace *)0x0) ||
                     (bVar10 = ON_SubDFace::GetSubdivisionPoint(local_140[lVar13][lVar19],local_228)
                     , !bVar10)) goto LAB_0061a5c8;
                  (*padVar2)[0] = local_228[0];
                  (*padVar2)[1] = local_228[1];
                  dVar6 = local_228[2];
LAB_00619faf:
                  iVar29 = iVar29 + 1;
                  (*padVar2)[2] = dVar6;
                }
              }
              else {
                bVar10 = ON_SubDVertex::IsCrease(this_00);
                if (bVar10) {
                  iVar17 = (int)local_238;
                  if (this->m_bBoundaryCrease[local_238] == true) {
                    if (this->m_bBoundaryCrease[local_1c8] != true) {
                      if (this->m_bBoundaryCrease[local_1c8] != false) goto LAB_00619fc3;
                      if (iVar17 == 3) {
                        local_228[0] = this->m_srf_cv1[1][4][0];
                        uVar30 = SUB84(local_228[0],0);
                        uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                        lVar13 = 4;
                        lVar19 = 2;
                        pdVar16 = local_e8;
                        pdVar18 = local_f0;
                      }
                      else {
                        if (iVar17 != 2) {
                          if (iVar17 == 1) {
                            local_228[0] = this->m_srf_cv1[3][0][0];
                            uVar30 = SUB84(local_228[0],0);
                            uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                            pdVar16 = local_108;
                            pdVar18 = local_110;
                            goto LAB_0061a307;
                          }
                          local_228[0] = this->m_srf_cv1[0][1][0];
                          uVar30 = SUB84(local_228[0],0);
                          uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                          pdVar16 = local_118;
                          pdVar18 = local_120;
                          goto LAB_0061a385;
                        }
                        local_228[0] = this->m_srf_cv1[4][3][0];
                        uVar30 = SUB84(local_228[0],0);
                        uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                        lVar13 = 2;
                        lVar19 = 4;
                        pdVar16 = local_f8;
                        pdVar18 = local_100;
                      }
                      goto LAB_0061a387;
                    }
                    if (iVar17 == 3) {
                      local_228[0] = (*local_150)[0];
                      uVar30 = SUB84(local_228[0],0);
                      uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                      pdVar16 = local_158;
                      pdVar18 = local_160;
                      padVar20 = local_168;
                      pdVar26 = local_170;
                      pdVar27 = local_178;
                    }
                    else if (iVar17 == 2) {
                      local_228[0] = (*local_168)[0];
                      uVar30 = SUB84(local_228[0],0);
                      uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                      pdVar16 = local_170;
                      pdVar18 = local_178;
                      padVar20 = local_180;
                      pdVar26 = local_188;
                      pdVar27 = local_190;
                    }
                    else if (iVar17 == 1) {
                      local_228[0] = (*local_180)[0];
                      uVar30 = SUB84(local_228[0],0);
                      uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                      pdVar16 = local_188;
                      pdVar18 = local_190;
                      padVar20 = local_198;
                      pdVar26 = local_1a0;
                      pdVar27 = local_1a8;
                    }
                    else {
                      local_228[0] = (*local_198)[0];
                      uVar30 = SUB84(local_228[0],0);
                      uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                      pdVar16 = local_1a0;
                      pdVar18 = local_1a8;
                      padVar20 = local_150;
                      pdVar26 = local_158;
                      pdVar27 = local_160;
                    }
                    local_228[1] = *pdVar16;
                    local_228[2] = *pdVar18;
                    local_228[3] = (*padVar20)[0];
                    local_228[4] = *pdVar26;
                    local_200 = *pdVar27;
                    local_1f8 = this->m_srf_cv1[2][2][0];
                    dStack_1f0 = this->m_srf_cv1[2][2][1];
                    local_1e8 = this->m_srf_cv1[2][2][2];
                    bVar10 = ON_IsValid((double)CONCAT44(uVar31,uVar30));
                    if (((bVar10) && (bVar10 = ON_IsValid(local_228[3]), bVar10)) &&
                       (bVar10 = ON_IsValid(local_1f8), paadVar8 = local_1e0, bVar10)) {
                      lVar13 = 1;
                      lVar19 = 1;
                      if (uVar11 < 3) {
                        lVar13 = *(long *)(&DAT_006d39a0 + uVar15 * 8);
                        lVar19 = *(long *)(&DAT_006d39b8 + uVar15 * 8);
                      }
                      bVar10 = ON_IsValid(local_1e0[lVar13][lVar19][0]);
                      if (bVar10) {
                        padVar20 = paadVar8[lVar13] + lVar19;
                        dVar6 = (*padVar20)[1] * -8.0 + (local_228[4] + local_228[1]) * 4.0 +
                                dStack_1f0;
                        auVar3._8_4_ = SUB84(dVar6,0);
                        auVar3._0_8_ = (*padVar20)[0] * -8.0 + (local_228[3] + local_228[0]) * 4.0 +
                                       local_1f8;
                        auVar3._12_4_ = (int)((ulong)dVar6 >> 0x20);
                        *(undefined1 (*) [16])*padVar2 = auVar3;
                        iVar29 = iVar29 + 1;
                        (*padVar2)[2] =
                             (*padVar20)[2] * -8.0 + (local_228[2] + local_200) * 4.0 + local_1e8;
                      }
                    }
                  }
                  else {
LAB_00619fc3:
                    if ((this->m_bBoundaryCrease[local_238] == false) &&
                       (this->m_bBoundaryCrease[local_1c8] == true)) {
                      if (iVar17 == 3) {
                        local_228[0] = this->m_srf_cv1[0][3][0];
                        uVar30 = SUB84(local_228[0],0);
                        uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                        pdVar16 = local_a8;
                        pdVar18 = local_b0;
LAB_0061a385:
                        lVar13 = 2;
                        lVar19 = 0;
                      }
                      else if (iVar17 == 2) {
                        local_228[0] = this->m_srf_cv1[3][4][0];
                        uVar30 = SUB84(local_228[0],0);
                        uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                        lVar13 = 4;
                        lVar19 = 2;
                        pdVar16 = local_b8;
                        pdVar18 = local_c0;
                      }
                      else if (iVar17 == 1) {
                        local_228[0] = this->m_srf_cv1[4][1][0];
                        uVar30 = SUB84(local_228[0],0);
                        uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                        lVar13 = 2;
                        lVar19 = 4;
                        pdVar16 = local_c8;
                        pdVar18 = local_d0;
                      }
                      else {
                        local_228[0] = this->m_srf_cv1[1][0][0];
                        uVar30 = SUB84(local_228[0],0);
                        uVar31 = (undefined4)((ulong)local_228[0] >> 0x20);
                        pdVar16 = local_d8;
                        pdVar18 = local_e0;
LAB_0061a307:
                        lVar19 = 2;
                        lVar13 = 0;
                      }
LAB_0061a387:
                      local_228[1] = *pdVar16;
                      local_228[2] = *pdVar18;
                      local_228[3] = local_1e0[lVar19][lVar13][0];
                      local_228[4] = local_1e0[lVar19][lVar13][1];
                      local_200 = local_1e0[lVar19][lVar13][2];
                      bVar10 = ON_IsValid((double)CONCAT44(uVar31,uVar30));
                      if ((bVar10) && (bVar10 = ON_IsValid(local_228[3]), bVar10)) {
                        dVar6 = (local_228[1] + local_228[1]) - local_228[4];
                        auVar4._8_4_ = SUB84(dVar6,0);
                        auVar4._0_8_ = (local_228[0] + local_228[0]) - local_228[3];
                        auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
                        *(undefined1 (*) [16])*padVar2 = auVar4;
                        dVar6 = (local_228[2] + local_228[2]) - local_200;
                        goto LAB_00619faf;
                      }
                    }
                    else if (this->m_bExactQuadrantPatch[local_238] == true) {
                      ON_SubDIncrementErrorCount();
                      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_limit.cpp"
                                 ,0x661,"","Why is this happening?");
                    }
                  }
                }
              }
            }
          }
          uVar22 = local_1b4 + (iVar29 == 0x10);
        }
        else if ((char)local_22c != '\0') goto LAB_00619a36;
        uVar15 = local_238 + 1;
      } while (local_1b8 != (uint)uVar15);
      if (uVar22 < local_1d8) {
        ON_SubDIncrementErrorCount();
      }
    }
  }
  return uVar22;
}

Assistant:

unsigned int ON_SubDQuadNeighborhood::SetLimitSubSurfaceExactCVs(
  bool bEnableApproximatePatch,
  unsigned int quadrant_index
  )
{
  // When subdivision_count >= 2, there should be 3 or 4 or more exact quadrants.
  // When the original SubD face is an n-gon, it is subdivided into quads and m_initial_subdivision_level = 1.
  const unsigned char subdivision_count
    = (m_current_subdivision_level > m_initial_subdivision_level)
    ? m_current_subdivision_level
    : 0;  if (bEnableApproximatePatch && (subdivision_count < 2 || m_extraordinary_corner_vertex_count > 1))
  {
    ON_SUBD_ERROR("bEnableApproximatePatch should be false at this stage.");
    bEnableApproximatePatch = false;
  }

  if (nullptr == m_face_grid[1][1] || 4 != m_face_grid[1][1]->m_edge_count || quadrant_index > 4)
    return ON_SUBD_RETURN_ERROR(0);

  // faces_vertices[] face, in counterclockwise order.  
  // m_center_edges[] are the 4 edges of face in counterclockwise order with 
  // m_center_edges[0] connecting face_vertices[0] and face_vertices[1].
  // However, it may be that face->Vertex(0) != face_vertices[0].
  const ON_SubDVertex* center_vertices[4] = { m_vertex_grid[1][1], m_vertex_grid[2][1], m_vertex_grid[2][2], m_vertex_grid[1][2] };
  for (unsigned int i = 0; i < 4; i++)
  {
    if (nullptr == center_vertices[i])
      return ON_SUBD_RETURN_ERROR(0);
    if (nullptr == m_center_edges[i])
      return ON_SUBD_RETURN_ERROR(0);
  }

  ON_2dex dex;
  ON_2dex deltadex;
  const ON_SubDFace* face;
  unsigned int i;
  double Q[3][3];
  double* P1[3];

  if (!ON_IsValid(m_srf_cv1[2][2][0]))
  {
    // All sub surfaces require inner 3x3 grid of subdivision points
    // In all cases these are the 9 subdivision points of the central quad
    // 9 points
    // = the quad face subdivision point at m_srf_cv1[2][2]
    // + 4 edge subdivision pointsat m_srf_cv1[2][1], m_srf_cv1[3][2], m_srf_cv1[2][3], m_srf_cv1[1][2]
    // + 4 vertex subdivision points at m_srf_cv1[1][1], m_srf_cv1[3][1], m_srf_cv1[3][3], m_srf_cv1[1][3] 
    face = m_face_grid[1][1];

    // The value of m_srf_cv1[2][2][0] is used to determine when the inner 3x3 grid is set, 
    // so its value must be set after the 8 cvs around it are successfully set.
    // The value 
    //   Q[2] = face subd point 
    // is calculated here because if face->GetSubdivisionPoint() fails,
    // nothing below should succeed. The value of Q[2] is assigned to m_srf_cv1[2][2]
    // after the 8 ring points are successfully calculated.
    if (!face->GetSubdivisionPoint(Q[2]))
    {
      return ON_SUBD_RETURN_ERROR(0);
    }


    const ON_2dex srf_cv_dex[8] = { { 1, 1 }, { 2, 1 }, { 3, 1 }, { 3, 2 }, { 3, 3 }, { 2, 3 }, { 1, 3 }, { 1, 2 } };

    for (unsigned int fei = 0; fei < 4; fei++)
    {
      if (!center_vertices[fei]->GetSubdivisionPoint( Q[0]))
        return ON_SUBD_RETURN_ERROR(0);
      if (!m_center_edges[fei]->GetSubdivisionPoint( Q[1]))
        return ON_SUBD_RETURN_ERROR(0);

      dex = srf_cv_dex[2 * fei];
      P1[0] = m_srf_cv1[dex.i][dex.j];
      P1[0][0] = Q[0][0]; P1[0][1] = Q[0][1]; P1[0][2] = Q[0][2];

      dex = srf_cv_dex[2 * fei + 1];
      P1[1] = m_srf_cv1[dex.i][dex.j];
      P1[1][0] = Q[1][0]; P1[1][1] = Q[1][1]; P1[1][2] = Q[1][2];
    }

    // m_srf_cv1[2][2][0] is used to determine when the inner 3x3 grid is set, 
    // so its value must be set after the 8 cvs around it are successfully set.
    P1[2] = m_srf_cv1[2][2];
    P1[2][0] = Q[2][0]; P1[2][1] = Q[2][1]; P1[2][2] = Q[2][2];
  }

  const unsigned int fvi_min = (4 == quadrant_index) ? 0 : quadrant_index;
  const unsigned int fvi_max = (4 == quadrant_index) ? 4 : fvi_min+1;
  unsigned int set_quadrant_count = 0;
  unsigned int exact_quadrant_count = 0;
  for (unsigned int fvi = fvi_min; fvi < fvi_max; fvi++)
  {
    if (m_bExactQuadrantPatch[fvi])
      ++exact_quadrant_count;
    else if (false == bEnableApproximatePatch)
      continue;

    unsigned int set_cv_count = 9; // 3x3 grid is set

    const unsigned int fvi3 = (fvi + 3) % 4;

    for (unsigned int side_pass = 0; side_pass < 2; side_pass++)
    {
      const unsigned int side_fvi = (0 == side_pass) ? fvi : fvi3;

      dex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 0);
      deltadex = ON_SubDQuadNeighborhood::DeltaDex(side_fvi, 1, 0);
      P1[0] = &m_srf_cv1[dex.i][dex.j][0];
      dex.i += deltadex.i;
      dex.j += deltadex.j;
      P1[1] = &m_srf_cv1[dex.i][dex.j][0];
      dex.i += deltadex.i;
      dex.j += deltadex.j;
      P1[2] = &m_srf_cv1[dex.i][dex.j][0];
      if (ON_IsValid(P1[0][0]) && ON_IsValid(P1[1][0]) && ON_IsValid(P1[2][0]))
      {
        set_cv_count += 3;
        continue; // Already set
      }

      // m_bBoundaryCrease[] is true if m_center_edges[fvi]->IsCrease() is true AND neither end is a dart vertex.
      // Using bCenterEdgeCrease0 is required to get correct results when bEnableApproximatePatch is true
      const bool bCenterEdgeCrease = bEnableApproximatePatch ? m_center_edges[side_fvi]->IsCrease() : m_bBoundaryCrease[side_fvi];

      if ( bCenterEdgeCrease )
      {
        // When approximation is being applied (m_bExactQuadrantPatch[fvi] is false and bEnableApproximatePatch is true),
        // This technique insures the approximations on either side of the crease 
        // create a continuous edge.
        ON_2dex Adex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 1);
        ON_2dex Bdex = ON_SubDQuadNeighborhood::GridDex(5, side_fvi, 1, 2);
        for (i = 0; i < 3; i++)
        {
          const double* A = m_srf_cv1[Adex.i][Adex.j];
          const double* B = m_srf_cv1[Bdex.i][Bdex.j];
          Q[i][0] = 2.0*A[0] - B[0];
          Q[i][1] = 2.0*A[1] - B[1];
          Q[i][2] = 2.0*A[2] - B[2];
          Adex.i += deltadex.i;
          Adex.j += deltadex.j;
          Bdex.i += deltadex.i;
          Bdex.j += deltadex.j;
        }
      }
      else if ( (m_bExactQuadrantPatch[fvi] || subdivision_count >= 2) && m_center_edges[side_fvi]->IsSmoothNotX() )
      {
        const ON_SubDEdge* edge = m_edge_grid[side_fvi][0];
        if (nullptr == edge)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[0][0] = ON_UNSET_VALUE;
        }
        else if (!edge->GetSubdivisionPoint(Q[0]))
          return ON_SUBD_RETURN_ERROR(0);

        const ON_2dex fdex = ON_SubDQuadNeighborhood::GridDex(3, side_fvi, 1, 0);
        face = m_face_grid[fdex.i][fdex.j];
        if (nullptr == face)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[1][0] = ON_UNSET_VALUE;
        }
        else if (!face->GetSubdivisionPoint(Q[1]))
          return ON_SUBD_RETURN_ERROR(0);

        edge = m_edge_grid[side_fvi][1];
        if (nullptr == edge)
        {
          if (m_bExactQuadrantPatch[fvi])
            return ON_SUBD_RETURN_ERROR(0);
          Q[2][0] = ON_UNSET_VALUE;
        }
        else if (!edge->GetSubdivisionPoint(Q[2]))
          return ON_SUBD_RETURN_ERROR(0);
      }
      else
      {
        // Need more subdivisions before these can be set.
        continue;
      }

      for (i = 0; i < 3; i++)
      {
        if (ON_IsValid(P1[i][0]))
        {
          ++set_cv_count;
          continue;
        }
        if (ON_IsValid(Q[i][0]))
        {
          ++set_cv_count;
          P1[i][0] = Q[i][0];
          P1[i][1] = Q[i][1];
          P1[i][2] = Q[i][2];
        }
      }
    }

    if (
      m_bExactQuadrantPatch[fvi] 
      ||
      (false == m_bExtraordinaryCornerVertex[fvi] && bEnableApproximatePatch))
    {
      dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 0);
      P1[0] = &m_srf_cv1[dex.i][dex.j][0];
      if (ON_IsValid(P1[0][0]))
      {
        ++set_cv_count;
      }
      else
      {
        if ( center_vertices[fvi]->IsSmooth() )
        {
          if (4 == center_vertices[fvi]->m_edge_count && 4 == center_vertices[fvi]->m_face_count)
          {
            dex = ON_SubDQuadNeighborhood::GridDex(3, fvi, 0, 0);
            const ON_SubDFace* face_ij = m_face_grid[dex.i][dex.j];
            if (nullptr == face_ij)
              return ON_SUBD_RETURN_ERROR(0);
            if (!face_ij->GetSubdivisionPoint(Q[0]))
              return ON_SUBD_RETURN_ERROR(0);
            ++set_cv_count;
            P1[0][0] = Q[0][0]; P1[0][1] = Q[0][1]; P1[0][2] = Q[0][2];
          }
        }
        else  if (center_vertices[fvi]->IsCrease())
        {
          if (m_bBoundaryCrease[fvi] && m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 1);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 2);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 2);
            Q[2][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[2][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[2][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]) && ON_IsValid(Q[2][0]))
            {
              dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 1);
              if (ON_IsValid(m_srf_cv1[dex.i][dex.j][0]))
              {
                const double c = -8.0;
                const double b = 4.0;
                ++set_cv_count;
                P1[0][0] = c * m_srf_cv1[dex.i][dex.j][0] + b * (Q[0][0] + Q[1][0]) + Q[2][0];
                P1[0][1] = c * m_srf_cv1[dex.i][dex.j][1] + b * (Q[0][1] + Q[1][1]) + Q[2][1];
                P1[0][2] = c * m_srf_cv1[dex.i][dex.j][2] + b * (Q[0][2] + Q[1][2]) + Q[2][2];
              }
            }
          }
          else if (m_bBoundaryCrease[fvi] && false == m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 1);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 0, 2);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]))
            {
              ++set_cv_count;
              P1[0][0] = 2.0 * Q[0][0] - Q[1][0];
              P1[0][1] = 2.0 * Q[0][1] - Q[1][1];
              P1[0][2] = 2.0 * Q[0][2] - Q[1][2];
            }
          }
          else if (false == m_bBoundaryCrease[fvi] && m_bBoundaryCrease[fvi3])
          {
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 1, 0);
            Q[0][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[0][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[0][2] = m_srf_cv1[dex.i][dex.j][2];
            dex = ON_SubDQuadNeighborhood::GridDex(5, fvi, 2, 0);
            Q[1][0] = m_srf_cv1[dex.i][dex.j][0];
            Q[1][1] = m_srf_cv1[dex.i][dex.j][1];
            Q[1][2] = m_srf_cv1[dex.i][dex.j][2];

            if (ON_IsValid(Q[0][0]) && ON_IsValid(Q[1][0]))
            {
              ++set_cv_count;
              P1[0][0] = 2.0 * Q[0][0] - Q[1][0];
              P1[0][1] = 2.0 * Q[0][1] - Q[1][1];
              P1[0][2] = 2.0 * Q[0][2] - Q[1][2];
            }
          }
          else if (m_bExactQuadrantPatch[fvi])
          {
            ON_SUBD_ERROR("Why is this happening?");
          }
        }
      }
    }
    if (16 == set_cv_count)
    {
      // quadrant with index fvi is set;
      ++set_quadrant_count;
    }
  }

  if (exact_quadrant_count > set_quadrant_count)
    return ON_SUBD_RETURN_ERROR(set_quadrant_count);

  return set_quadrant_count;
}